

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<absl::lts_20250127::Cord>
::NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<absl::lts_20250127::Cord>
           *this)

{
  NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<absl::lts_20250127::Cord>
  *this_local;
  
  NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::NoFieldPresenceMapSerializeTest
            (&this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>);
  (this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).super_Test._vptr_Test =
       (_func_int **)
       &PTR__NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test_029dfac0;
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest,
           MapRoundTripZeroKeyZeroExplicitMessage) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_explicit_foreign_message())[0].set_c(0);

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  // TODO: b/368089585 - write this better when we have access to EqualsProto.
  EXPECT_EQ(rt_msg.map_int32_explicit_foreign_message().at(0).c(),
            msg.map_int32_explicit_foreign_message().at(0).c());

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(0, rt_msg.map_int32_explicit_foreign_message().at(0).c());

  // However, explicit presence messages expose a `has_foo` API.
  // Because fields in an explicit message is explicitly set, they are expected
  // to be present.
  EXPECT_TRUE(rt_msg.map_int32_explicit_foreign_message().at(0).has_c());
}